

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressBegin_advanced
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pledgedSrcSize)

{
  ZSTD_format_e ZVar1;
  ZSTD_CCtx_params params_00;
  ZSTD_parameters ZVar2;
  size_t sVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  byte bVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [24];
  undefined1 in_stack_fffffffffffffeb4 [92];
  undefined1 auVar14 [24];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  uint local_90;
  ZSTD_strategy ZStack_8c;
  ZSTD_frameParameters ZStack_88;
  undefined4 local_7c;
  undefined1 local_78 [72];
  
  ZVar2 = params;
  bVar7 = 0;
  ZVar1 = (cctx->requestedParams).format;
  memcpy(local_78,&(cctx->requestedParams).disableLiteralCompression,0x48);
  local_a8 = CONCAT44(params.cParams.windowLog,ZVar1);
  local_a0 = params.cParams._4_8_;
  uStack_98 = params.cParams._12_8_;
  ZStack_88.noDictIDFlag = params.fParams.noDictIDFlag;
  local_90 = params.cParams.targetLength;
  ZStack_8c = params.cParams.strategy;
  ZStack_88.contentSizeFlag = params.fParams.contentSizeFlag;
  ZStack_88.checksumFlag = params.fParams.checksumFlag;
  local_7c = 3;
  uVar11 = ZVar2.cParams.searchLength;
  uVar8 = ZVar2.cParams._0_8_;
  uVar9 = ZVar2.cParams.hashLog;
  uVar10 = ZVar2.cParams.searchLog;
  sVar3 = ZSTD_checkCParams(ZVar2.cParams);
  if (sVar3 < 0xffffffffffffff89) {
    puVar5 = &local_a8;
    puVar6 = (undefined8 *)&stack0xfffffffffffffe98;
    for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar6 = *puVar5;
      puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
    }
    params_00.cParams.chainLog = uVar9;
    params_00.format = (int)uVar8;
    params_00.cParams.windowLog = (int)((ulong)uVar8 >> 0x20);
    params_00.cParams.hashLog = uVar10;
    params_00.cParams.searchLog = uVar11;
    params_00.cParams.searchLength = params.cParams.targetLength;
    params_00.cParams.targetLength = params.cParams.strategy;
    auVar12 = in_stack_fffffffffffffeb4._4_12_;
    auVar13 = in_stack_fffffffffffffeb4._40_24_;
    auVar14 = in_stack_fffffffffffffeb4._68_24_;
    params_00.cParams.strategy = in_stack_fffffffffffffeb4._0_4_;
    params_00.fParams.contentSizeFlag = auVar12._0_4_;
    params_00.fParams.checksumFlag = auVar12._4_4_;
    params_00.fParams.noDictIDFlag = auVar12._8_4_;
    params_00.compressionLevel = in_stack_fffffffffffffeb4._16_4_;
    params_00.disableLiteralCompression = in_stack_fffffffffffffeb4._20_4_;
    params_00.forceWindow = in_stack_fffffffffffffeb4._24_4_;
    params_00.nbWorkers = in_stack_fffffffffffffeb4._28_4_;
    params_00.jobSize = in_stack_fffffffffffffeb4._32_4_;
    params_00.overlapSizeLog = in_stack_fffffffffffffeb4._36_4_;
    params_00.ldmParams.enableLdm = auVar13._0_4_;
    params_00.ldmParams.hashLog = auVar13._4_4_;
    params_00.ldmParams.bucketSizeLog = auVar13._8_4_;
    params_00.ldmParams.minMatchLength = auVar13._12_4_;
    params_00.ldmParams.hashEveryLog = auVar13._16_4_;
    params_00.ldmParams.windowLog = auVar13._20_4_;
    params_00._92_4_ = in_stack_fffffffffffffeb4._64_4_;
    params_00.customMem.customAlloc = (ZSTD_allocFunction)auVar14._0_8_;
    params_00.customMem.customFree = (ZSTD_freeFunction)auVar14._8_8_;
    params_00.customMem.opaque = (void *)auVar14._16_8_;
    sVar3 = ZSTD_compressBegin_internal
                      (cctx,dict,dictSize,ZSTD_dct_auto,ZSTD_dtlm_fast,(ZSTD_CDict *)0x0,params_00,
                       pledgedSrcSize,ZSTDb_not_buffered);
  }
  return sVar3;
}

Assistant:

size_t ZSTD_compressBegin_advanced(ZSTD_CCtx* cctx,
                             const void* dict, size_t dictSize,
                                   ZSTD_parameters params, unsigned long long pledgedSrcSize)
{
    ZSTD_CCtx_params const cctxParams =
            ZSTD_assignParamsToCCtxParams(cctx->requestedParams, params);
    return ZSTD_compressBegin_advanced_internal(cctx,
                                            dict, dictSize, ZSTD_dct_auto, ZSTD_dtlm_fast,
                                            NULL /*cdict*/,
                                            cctxParams, pledgedSrcSize);
}